

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_container.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
* __thiscall
absl::lts_20250127::container_internal::
btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>>
::emplace<int,google::protobuf::OneofDescriptor_const*&>
          (pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>,_bool>
           *__return_storage_ptr__,void *this,int *args,OneofDescriptor **args_1)

{
  int *key;
  OneofDescriptor **in_R8;
  slot_type *local_58;
  slot_type *slot;
  CommonAccess local_39;
  undefined1 local_38 [8];
  node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
  node;
  OneofDescriptor **args_local_1;
  int *args_local;
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  *this_local;
  
  node.
  super_node_handle_base<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  .slot_space_._8_8_ = args_1;
  btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
  ::get_allocator((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                   *)&local_39);
  CommonAccess::
  Construct<absl::lts_20250127::container_internal::node_handle<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>,absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,void>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,int,google::protobuf::OneofDescriptor_const*&>
            ((node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
              *)local_38,&local_39,
             (allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_> *)args,
             (int *)node.
                    super_node_handle_base<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
                    .slot_space_._8_8_,in_R8);
  std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>::~allocator
            ((allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_> *)
             &local_39);
  local_58 = CommonAccess::
             GetSlot<absl::lts_20250127::container_internal::node_handle<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>,absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,void>>
                       ((node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
                         *)local_38);
  key = map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>
        ::key(local_58);
  btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
  ::
  insert_unique<int,absl::lts_20250127::container_internal::map_slot_type<int,google::protobuf::OneofDescriptor_const*>*&>
            (__return_storage_ptr__,
             (btree<absl::lts_20250127::container_internal::map_params<int,google::protobuf::OneofDescriptor_const*,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::OneofDescriptor_const*>>,256,false>>
              *)this,key,&local_58);
  node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
  ::~node_handle((node_handle<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_void>
                  *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace(Args &&...args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    // Use a node handle to manage a temp slot.
    auto node = CommonAccess::Construct<node_type>(this->get_allocator(),
                                                   std::forward<Args>(args)...);
    auto *slot = CommonAccess::GetSlot(node);
    return this->tree_.insert_unique(params_type::key(slot), slot);
  }